

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::RedundantFDiv::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *param_1,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l_00;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *pvVar1;
  bool bVar2;
  Op OVar3;
  size_type sVar4;
  const_reference ppCVar5;
  Operand *local_190;
  Operand *local_170;
  allocator<spvtools::opt::Operand> local_165;
  uint32_t local_164;
  iterator local_160;
  undefined8 local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  Operand local_128;
  iterator local_f8;
  _func_int **local_f0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_e8;
  allocator<spvtools::opt::Operand> local_cd;
  uint32_t local_cc;
  iterator local_c8;
  undefined8 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  Operand local_90;
  iterator local_60;
  _func_int **local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_50;
  FloatConstantKind local_38;
  FloatConstantKind local_34;
  FloatConstantKind kind1;
  FloatConstantKind kind0;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *param_1_local;
  anon_class_1_0_00000001 *this_local;
  
  _kind1 = constants;
  constants_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)param_1;
  param_1_local = (IRContext *)this;
  OVar3 = opt::Instruction::opcode(inst);
  if (OVar3 != OpFDiv) {
    __assert_fail("inst->opcode() == spv::Op::OpFDiv && \"Wrong opcode.  Should be OpFDiv.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x98f,
                  "auto spvtools::opt::(anonymous namespace)::RedundantFDiv()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  sVar4 = std::
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ::size(_kind1);
  if (sVar4 != 2) {
    __assert_fail("constants.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x990,
                  "auto spvtools::opt::(anonymous namespace)::RedundantFDiv()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  bVar2 = opt::Instruction::IsFloatingPointFoldingAllowed((Instruction *)constants_local);
  if (bVar2) {
    ppCVar5 = std::
              vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ::operator[](_kind1,0);
    local_34 = getFloatConstantKind(*ppCVar5);
    ppCVar5 = std::
              vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ::operator[](_kind1,1);
    local_38 = getFloatConstantKind(*ppCVar5);
    if (local_34 == Zero) {
      opt::Instruction::SetOpcode((Instruction *)constants_local,OpCopyObject);
      pvVar1 = constants_local;
      local_cc = opt::Instruction::GetSingleWordInOperand((Instruction *)constants_local,0);
      local_c8 = &local_cc;
      local_c0 = 1;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_c8;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list_00);
      Operand::Operand(&local_90,SPV_OPERAND_TYPE_ID,&local_b8);
      local_60 = &local_90;
      local_58 = (_func_int **)0x1;
      std::allocator<spvtools::opt::Operand>::allocator(&local_cd);
      __l_00._M_len = (size_type)local_58;
      __l_00._M_array = local_60;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_50,__l_00,&local_cd);
      opt::Instruction::SetInOperands((Instruction *)pvVar1,&local_50);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_50);
      std::allocator<spvtools::opt::Operand>::~allocator(&local_cd);
      local_170 = (Operand *)&local_60;
      do {
        local_170 = local_170 + -1;
        Operand::~Operand(local_170);
      } while (local_170 != &local_90);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
      this_local._7_1_ = true;
    }
    else if (local_38 == One) {
      opt::Instruction::SetOpcode((Instruction *)constants_local,OpCopyObject);
      pvVar1 = constants_local;
      local_164 = opt::Instruction::GetSingleWordInOperand((Instruction *)constants_local,0);
      local_160 = &local_164;
      local_158 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_160;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list);
      Operand::Operand(&local_128,SPV_OPERAND_TYPE_ID,&local_150);
      local_f8 = &local_128;
      local_f0 = (_func_int **)0x1;
      std::allocator<spvtools::opt::Operand>::allocator(&local_165);
      __l._M_len = (size_type)local_f0;
      __l._M_array = local_f8;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_e8,__l,&local_165);
      opt::Instruction::SetInOperands((Instruction *)pvVar1,&local_e8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_e8);
      std::allocator<spvtools::opt::Operand>::~allocator(&local_165);
      local_190 = (Operand *)&local_f8;
      do {
        local_190 = local_190 + -1;
        Operand::~Operand(local_190);
      } while (local_190 != &local_128);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

FoldingRule RedundantFDiv() {
  return [](IRContext*, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    assert(inst->opcode() == spv::Op::OpFDiv &&
           "Wrong opcode.  Should be OpFDiv.");
    assert(constants.size() == 2);

    if (!inst->IsFloatingPointFoldingAllowed()) {
      return false;
    }

    FloatConstantKind kind0 = getFloatConstantKind(constants[0]);
    FloatConstantKind kind1 = getFloatConstantKind(constants[1]);

    if (kind0 == FloatConstantKind::Zero) {
      inst->SetOpcode(spv::Op::OpCopyObject);
      inst->SetInOperands(
          {{SPV_OPERAND_TYPE_ID, {inst->GetSingleWordInOperand(0)}}});
      return true;
    }

    if (kind1 == FloatConstantKind::One) {
      inst->SetOpcode(spv::Op::OpCopyObject);
      inst->SetInOperands(
          {{SPV_OPERAND_TYPE_ID, {inst->GetSingleWordInOperand(0)}}});
      return true;
    }

    return false;
  };
}